

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O3

void QPlatformFontDatabase::registerFont
               (QString *familyname,QString *stylename,QString *foundryname,Weight weight,
               Style style,Stretch stretch,bool antialiased,bool scalable,int pixelSize,
               bool fixedPitch,bool colorFont,QSupportedWritingSystems *writingSystems,void *usrPtr)

{
  int pixelSize_00;
  
  pixelSize_00 = 0;
  if (!scalable) {
    pixelSize_00 = pixelSize;
  }
  qt_registerFont(familyname,stylename,foundryname,weight,style,stretch,antialiased,scalable,
                  pixelSize_00,fixedPitch,colorFont,writingSystems,usrPtr);
  return;
}

Assistant:

void QPlatformFontDatabase::registerFont(const QString &familyname, const QString &stylename,
                                         const QString &foundryname, QFont::Weight weight,
                                         QFont::Style style, QFont::Stretch stretch, bool antialiased,
                                         bool scalable, int pixelSize, bool fixedPitch, bool colorFont,
                                         const QSupportedWritingSystems &writingSystems, void *usrPtr)
{
    if (scalable)
        pixelSize = 0;

    qt_registerFont(familyname, stylename, foundryname, weight, style,
                    stretch, antialiased, scalable, pixelSize,
                    fixedPitch, colorFont, writingSystems, usrPtr);
}